

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_stream.hpp
# Opt level: O2

void __thiscall
cfgfile::input_stream_t<cfgfile::string_trait_t>::~input_stream_t
          (input_stream_t<cfgfile::string_trait_t> *this)

{
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->m_buf).super__Vector_base<char,_std::allocator<char>_>);
  std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base
            ((_Deque_base<char,_std::allocator<char>_> *)&this->m_returned_char);
  std::__cxx11::string::~string((string *)&this->m_file_name);
  std::
  _Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
  ::~_Deque_base((_Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
                  *)&this->m_prev_positions);
  return;
}

Assistant:

~input_stream_t()
	{
	}